

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskTable.h
# Opt level: O2

SSTableData * __thiscall
DiskTable::
merge<std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>*,std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>*>
          (SSTableData *__return_storage_ptr__,DiskTable *this,
          vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *datas,
          vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *datas_1)

{
  anon_class_16_1_1a1a2d91 __f;
  bool bVar1;
  iterator seq2;
  pointer candidate;
  initializer_list<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>
  __l;
  allocator_type local_61;
  vector<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>_>
  merge_seqs;
  MergeSeq local_48;
  pointer local_38;
  pointer pSStack_30;
  
  local_48.first._M_current =
       (datas->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>)._M_impl.
       super__Vector_impl_data._M_start;
  local_48.second._M_current =
       (datas->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  local_38 = (datas_1->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>).
             _M_impl.super__Vector_impl_data._M_start;
  pSStack_30 = (datas_1->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>).
               _M_impl.super__Vector_impl_data._M_finish;
  __l._M_len = 2;
  __l._M_array = &local_48;
  std::
  vector<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>_>
  ::vector(&merge_seqs,__l,&local_61);
  (__return_storage_ptr__->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    local_48.first._M_current =
         ((merge_seqs.
           super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->first)._M_current;
    local_48.second._M_current =
         ((merge_seqs.
           super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->second)._M_current;
    for (candidate = merge_seqs.
                     super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        candidate !=
        merge_seqs.
        super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; candidate = candidate + 1) {
      bVar1 = merge<std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_*>
              ::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)
                         &merge<std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>*,std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>*>(std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>*,std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>*)
                          ::compare_merge_seqs_prefer_current,candidate,&local_48);
      if (bVar1) {
        local_48.first._M_current = (candidate->first)._M_current;
        local_48.second._M_current = (candidate->second)._M_current;
      }
    }
    __f.merge_resolution.second._M_current = local_48.second._M_current;
    __f.merge_resolution.first._M_current = local_48.first._M_current;
    std::
    for_each<__gnu_cxx::__normal_iterator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry*,std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>>,__gnu_cxx::__normal_iterator<SSTableDataEntry*,std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>>>*,std::vector<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry*,std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>>,__gnu_cxx::__normal_iterator<SSTableDataEntry*,std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>>>,std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry*,std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>>,__gnu_cxx::__normal_iterator<SSTableDataEntry*,std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>>>>>>,DiskTable::merge<std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>*,std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>*>(std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>*,std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>*)::_lambda(std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry*,std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>>,__gnu_cxx::__normal_iterator<SSTableDataEntry*,std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>>>&)_1_>
              ((__normal_iterator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_*,_std::vector<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>_>_>
                )merge_seqs.
                 super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_*,_std::vector<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>_>_>
                )merge_seqs.
                 super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,__f);
    if (local_48.first._M_current == local_48.second._M_current) break;
    std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::push_back
              (__return_storage_ptr__,local_48.first._M_current);
  }
  std::
  _Vector_base<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>_>
  ::~_Vector_base(&merge_seqs.
                   super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>_>
                 );
  return __return_storage_ptr__;
}

Assistant:

SSTableData DiskTable::merge(Datas... datas) {
    /* A MergeSeq is a pair abstracting a Sequence of SSTableDataEntry objects to be merged together.
     * It's made up of two iterator, from same SSTableData object, first one indicating current position of the sequence,
     * second one indicating the end of the sequence, so when first==second, the sequence has been consumed fully.
     */
    auto merge_seqs = std::vector<MergeSeq>{{datas->begin(), datas->end()}...};
    auto merge_result = SSTableData{};
    static auto compare_merge_seqs_prefer_current = [](const MergeSeq &candidate, const MergeSeq &current) {
        /*
         * Determining whether candidate or current has been fully consumed or not.
         * if candidate has ran out of and current not, take current, or vice versa.
         * if both candidate and current are fully consumed, continue to find another sequence.
         * When all sequences of merge_seqs have been fully consumed, min_element would
         * return a ended sequence eventually, and merge process terminates at that time.
         */
        if (candidate.first == candidate.second && current.first != current.second) {
            return false;
        }
        if (candidate.first != candidate.second && current.first == current.second) {
            return true;
        }
        if (candidate.first == candidate.second && current.first == current.second) {
            return false;
        }
        /*
         * If candidate and current have not been fully consumed, compare key of their
         * current entry, take smaller one, if their key equals, compare timestamp,
         * and take larger one.
         * If timestamp equals, takes current, because first in data takes precedence in merge function.
         */
        if (candidate.first->key < current.first->key) {
            return true;
        } else if (candidate.first->key == current.first->key) {
            return candidate.first->timestamp >
                   current.first->timestamp;
        } else {
            return false;
        }
    };
    while (true) {
        auto merge_resolution = *merge_seqs.begin();
        for (auto seq2 = merge_seqs.begin(); seq2 != merge_seqs.end(); seq2++) {
            if (compare_merge_seqs_prefer_current(*seq2, merge_resolution)) {
                merge_resolution = *seq2;
            }
        }
        std::for_each(merge_seqs.begin(), merge_seqs.end(), [merge_resolution](MergeSeq &seq) {
            if (seq.first->key == merge_resolution.first->key && seq.first != seq.second) {
                ++seq.first;
            }
        });
        if (merge_resolution.first == merge_resolution.second) {
            break;
        }
        merge_result.push_back(*merge_resolution.first);
    }
    return merge_result;
}